

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linecurve.cpp
# Opt level: O0

bool __thiscall ON_LineCurve::IsValid(ON_LineCurve *this,ON_TextLog *text_log)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  bool local_19;
  bool rc;
  ON_TextLog *text_log_local;
  ON_LineCurve *this_local;
  
  local_19 = true;
  dVar2 = ON_Interval::operator[](&this->m_t,0);
  dVar3 = ON_Interval::operator[](&this->m_t,1);
  if (dVar3 < dVar2) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,L"Line domain not valid.");
    }
    local_19 = false;
  }
  bVar1 = ON_3dPoint::IsCoincident(&(this->m_line).from,&(this->m_line).to);
  if (bVar1) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,L"Line points are coincident.");
    }
    local_19 = false;
  }
  return local_19;
}

Assistant:

bool ON_LineCurve::IsValid( ON_TextLog* text_log ) const
{
  bool rc = true;
  if (m_t[0] > m_t[1])
  {
    if (text_log) text_log->Print(L"Line domain not valid.");
    rc = false;
  }
  if (m_line.from.IsCoincident(m_line.to))
  {
    if (text_log) text_log->Print(L"Line points are coincident.");
    rc = false;
  }
  return rc;
}